

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMMapping.c
# Opt level: O3

_Bool ARM_rel_branch(cs_struct *h,uint id)

{
  uint *puVar1;
  long lVar2;
  bool bVar3;
  
  lVar2 = 0;
  do {
    puVar1 = (uint *)((long)insn_rel + lVar2);
    if (*puVar1 == id) break;
    bVar3 = lVar2 != 0x30;
    lVar2 = lVar2 + 4;
  } while (bVar3);
  return *puVar1 == id;
}

Assistant:

bool ARM_rel_branch(cs_struct *h, unsigned int id)
{
	int i;

	for (i = 0; insn_rel[i]; i++) {
		if (id == insn_rel[i]) {
			return true;
		}
	}

	// not found
	return false;
}